

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O2

void * ipasir_init(void)

{
  IPAsirMiniSAT *this;
  
  this = (IPAsirMiniSAT *)operator_new(0x1560);
  IPAsirMiniSAT::IPAsirMiniSAT(this);
  return this;
}

Assistant:

void *ipasir_init() { return new IPAsirMiniSAT(); }